

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O0

bool __thiscall miniros::NodeHandle::hasParam(NodeHandle *this,string *key)

{
  bool bVar1;
  MasterLink *in_stack_00000078;
  string local_40 [31];
  undefined1 in_stack_ffffffffffffffdf;
  string *in_stack_ffffffffffffffe0;
  NodeHandle *in_stack_ffffffffffffffe8;
  
  getMasterLink((NodeHandle *)&stack0xffffffffffffffe0);
  std::__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::MasterLink,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x47aa71);
  resolveName(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf);
  bVar1 = MasterLink::has(in_stack_00000078,&this->namespace_);
  std::__cxx11::string::~string(local_40);
  std::shared_ptr<miniros::MasterLink>::~shared_ptr((shared_ptr<miniros::MasterLink> *)0x47aaba);
  return bVar1;
}

Assistant:

bool NodeHandle::hasParam(const std::string& key) const
{
  return getMasterLink()->has(resolveName(key));
}